

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void setnodevector(lua_State *L,Table *t,uint size)

{
  uint uVar1;
  Node *pNVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (size == 0) {
    t->node = &dummynode_;
    t->lsizenode = '\0';
    t->hmask = 0;
    pNVar2 = (Node *)0x0;
  }
  else {
    uVar1 = luaO_ceillog2(size);
    if (0x1e < (int)uVar1) {
      luaG_runerror(L,"table overflow");
    }
    uVar5 = 1 << (uVar1 & 0x1f);
    uVar6 = (ulong)uVar5;
    pNVar2 = (Node *)luaM_realloc_(L,(void *)0x0,0,uVar6 * 0x20);
    t->node = pNVar2;
    lVar3 = 0x1c;
    uVar4 = uVar6;
    do {
      pNVar2 = t->node;
      *(undefined4 *)((long)&(pNVar2->i_val).value_ + lVar3) = 0;
      *(undefined2 *)((long)pNVar2 + lVar3 + -4) = 0;
      *(undefined2 *)((long)pNVar2 + lVar3 + -0x14) = 0;
      lVar3 = lVar3 + 0x20;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    t->lsizenode = (lu_byte)uVar1;
    t->hmask = uVar5 - 1;
    pNVar2 = t->node + uVar6;
  }
  t->lastfree = pNVar2;
  return;
}

Assistant:

static void setnodevector (lua_State *L, Table *t, unsigned int size) {
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common 'dummynode' */
    t->lsizenode = 0;
#if RAVI_USE_NEWHASH
    t->hmask = 0;
#endif
    t->lastfree = NULL;  /* signal that it is using dummy node */
  }
  else {
    int i;
    int lsize = luaO_ceillog2(size);
    if (lsize > MAXHBITS)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    t->node = luaM_newvector(L, size, Node);
    for (i = 0; i < (int)size; i++) {
      Node *n = gnode(t, i);
      gnext(n) = 0;
      setnilvalue(wgkey(n));
      setnilvalue(gval(n));
    }
    t->lsizenode = cast_byte(lsize);
#if RAVI_USE_NEWHASH
    t->hmask = size - 1;
#endif
    t->lastfree = gnode(t, size);  /* all positions are free */
  }
}